

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O2

tuple<int,_int,_int> __thiscall libtorrent::dht::routing_table::size(routing_table *this)

{
  int iVar1;
  routing_table_node *i;
  long *plVar2;
  long in_RSI;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  tuple<int,_int,_int> tVar8;
  
  iVar1 = 0;
  iVar3 = 0;
  iVar4 = 0;
  for (plVar2 = *(long **)(in_RSI + 0x10); plVar2 != *(long **)(in_RSI + 0x18); plVar2 = plVar2 + 6)
  {
    lVar7 = plVar2[3];
    uVar6 = plVar2[4] - lVar7;
    iVar5 = 0;
    for (; lVar7 != plVar2[4]; lVar7 = lVar7 + 0x40) {
      iVar5 = iVar5 + (uint)(*(char *)(lVar7 + 0x3a) == '\0');
    }
    iVar4 = iVar4 + (int)(uVar6 >> 6);
    iVar3 = iVar3 + iVar5;
    iVar1 = iVar1 + (int)((ulong)(plVar2[1] - *plVar2) >> 6);
  }
  *(int *)&this->m_log = iVar3;
  *(int *)((long)&this->m_log + 4) = iVar1;
  *(int *)&this->m_settings = iVar4;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       (int)plVar2;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar8.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> routing_table::size() const
{
	int nodes = 0;
	int replacements = 0;
	int confirmed = 0;
	for (auto const& i : m_buckets)
	{
		nodes += int(i.live_nodes.size());
		confirmed += static_cast<int>(std::count_if(i.live_nodes.begin(), i.live_nodes.end()
			, [](node_entry const& k) { return k.confirmed(); } ));

		replacements += int(i.replacements.size());
	}
	return std::make_tuple(nodes, replacements, confirmed);
}